

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

void __thiscall
minja::FilterNode::FilterNode
          (FilterNode *this,Location *loc,shared_ptr<minja::Expression> *f,
          shared_ptr<minja::TemplateNode> *b)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR___cxa_pure_virtual_00273520;
  (this->super_TemplateNode).location_.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (loc->source).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (loc->source).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->super_TemplateNode).location_.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->super_TemplateNode).location_.pos = loc->pos;
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR_do_render_00273948;
  (this->filter).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (f->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (f->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (f->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filter).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->filter).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (f->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

TemplateNode(const Location & location) : location_(location) {}